

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

double HistoQueuePush(HistoQueue *histo_queue,VP8LHistogram **histograms,int idx1,int idx2,
                     double threshold)

{
  int iVar1;
  HistogramPair *pHVar2;
  int in_ECX;
  int in_EDX;
  HistoQueue *in_RDI;
  double in_XMM0_Qa;
  int tmp;
  HistogramPair pair;
  VP8LHistogram *h2;
  VP8LHistogram *h1;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  VP8LHistogram *in_stack_ffffffffffffffb8;
  VP8LHistogram *in_stack_ffffffffffffffc0;
  int local_20;
  int local_1c;
  VP8LHistogram *local_8;
  
  if (in_RDI->size == in_RDI->max_size) {
    local_8 = (VP8LHistogram *)0x0;
  }
  else {
    local_20 = in_ECX;
    local_1c = in_EDX;
    if (in_ECX < in_EDX) {
      in_stack_ffffffffffffffac = in_ECX;
      local_20 = in_EDX;
      local_1c = in_ECX;
    }
    HistoQueueUpdatePair
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (double)CONCAT44(local_20,local_1c),
               (HistogramPair *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if ((double)in_stack_ffffffffffffffb8 < in_XMM0_Qa) {
      iVar1 = in_RDI->size;
      in_RDI->size = iVar1 + 1;
      pHVar2 = in_RDI->queue + iVar1;
      pHVar2->idx1 = local_1c;
      pHVar2->idx2 = local_20;
      pHVar2->cost_diff = (double)in_stack_ffffffffffffffb8;
      pHVar2->cost_combo = (double)in_stack_ffffffffffffffc0;
      HistoQueueUpdateHead(in_RDI,in_RDI->queue + (in_RDI->size + -1));
      local_8 = in_stack_ffffffffffffffb8;
    }
    else {
      local_8 = (VP8LHistogram *)0x0;
    }
  }
  return (double)local_8;
}

Assistant:

static double HistoQueuePush(HistoQueue* const histo_queue,
                             VP8LHistogram** const histograms, int idx1,
                             int idx2, double threshold) {
  const VP8LHistogram* h1;
  const VP8LHistogram* h2;
  HistogramPair pair;

  // Stop here if the queue is full.
  if (histo_queue->size == histo_queue->max_size) return 0.;
  assert(threshold <= 0.);
  if (idx1 > idx2) {
    const int tmp = idx2;
    idx2 = idx1;
    idx1 = tmp;
  }
  pair.idx1 = idx1;
  pair.idx2 = idx2;
  h1 = histograms[idx1];
  h2 = histograms[idx2];

  HistoQueueUpdatePair(h1, h2, threshold, &pair);

  // Do not even consider the pair if it does not improve the entropy.
  if (pair.cost_diff >= threshold) return 0.;

  histo_queue->queue[histo_queue->size++] = pair;
  HistoQueueUpdateHead(histo_queue, &histo_queue->queue[histo_queue->size - 1]);

  return pair.cost_diff;
}